

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::egl::GLES2ThreadedSharingTest::iterate(GLES2ThreadedSharingTest *this)

{
  undefined1 auVar1 [8];
  bool bVar2;
  uint uVar3;
  IterateResult IVar4;
  int iVar5;
  int iVar6;
  deUint64 dVar7;
  pointer ppEVar8;
  NotSupportedError *this_00;
  char *description;
  bool bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  vector<int,_std::allocator<int>_> indices;
  Message message;
  vector<int,_std::allocator<int>_> local_1f0;
  Message local_1d8;
  undefined1 local_1b0 [8];
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  if (this->m_threadsStarted == false) {
    dVar7 = deGetMicroseconds();
    this->m_beginTimeUs = dVar7;
    ppEVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_threads).
                                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3)) {
      lVar13 = 0;
      do {
        tcu::ThreadUtil::Thread::exec(&ppEVar8[lVar13]->super_Thread);
        lVar13 = lVar13 + 1;
        ppEVar8 = (this->m_threads).
                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (lVar13 < (int)((ulong)((long)(this->m_threads).
                                            super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppEVar8) >> 3));
    }
    this->m_threadsStarted = true;
    this->m_threadsRunning = true;
  }
  if (this->m_threadsRunning == true) {
    ppEVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(this->m_threads).
                                 super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3);
    if ((int)uVar3 < 1) {
      uVar10 = 0;
    }
    else {
      uVar11 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 + ((ppEVar8[uVar11]->super_Thread).m_status != THREADSTATUS_RUNNING);
        uVar11 = uVar11 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar11);
    }
    if (uVar10 == uVar3) {
      ppEVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3))
      {
        lVar13 = 0;
        do {
          de::Thread::join((Thread *)ppEVar8[lVar13]);
          lVar13 = lVar13 + 1;
          ppEVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar13 < (int)((ulong)((long)(this->m_threads).
                                              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppEVar8) >> 3));
      }
      this->m_executionReady = true;
      this->m_requiresRestart = false;
    }
    dVar7 = deGetMicroseconds();
    if (this->m_timeOutUs < dVar7 - this->m_beginTimeUs) {
      ppEVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (int)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3))
      {
        lVar13 = 0;
        do {
          if ((ppEVar8[lVar13]->super_Thread).m_status != THREADSTATUS_RUNNING) {
            de::Thread::join((Thread *)ppEVar8[lVar13]);
          }
          lVar13 = lVar13 + 1;
          ppEVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (lVar13 < (int)((ulong)((long)(this->m_threads).
                                              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppEVar8) >> 3));
      }
      this->m_executionReady = true;
      this->m_requiresRestart = true;
      dVar7 = deGetMicroseconds();
      this->m_timeOutTimeUs = dVar7;
    }
    else {
      deSleep(this->m_sleepTimeMs);
    }
  }
  IVar4 = CONTINUE;
  if (this->m_executionReady == true) {
    local_1b0 = (undefined1  [8])((ulong)(uint)local_1b0._4_4_ << 0x20);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_1f0,
               (long)(this->m_threads).
                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_threads).
                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,
               (value_type_conflict1 *)local_1b0,(allocator_type *)&local_1d8);
    if (this->m_timeOutTimeUs != 0) {
      local_1b0 = (undefined1  [8])this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous."
                 ,0x5e);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    do {
      ppEVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar11 = 0xffffffff;
      if (0 < (int)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3))
      {
        uVar11 = 0;
        do {
          iVar5 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar8[uVar11]->super_Thread);
          if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar11] < iVar5) {
            uVar11 = uVar11 & 0xffffffff;
            goto LAB_00e11a6b;
          }
          ppEVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = uVar11 + 1;
        } while ((int)uVar11 <
                 (int)((ulong)((long)(this->m_threads).
                                     super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >>
                      3));
        uVar11 = 0xffffffff;
      }
LAB_00e11a6b:
      iVar5 = (int)uVar11;
      if (iVar5 == -1) break;
      ppEVar8 = (this->m_threads).
                super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar6 = iVar5;
      if (0 < (int)((ulong)((long)(this->m_threads).
                                  super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3))
      {
        uVar14 = 0;
        do {
          iVar6 = tcu::ThreadUtil::Thread::getMessageCount(&ppEVar8[uVar14]->super_Thread);
          if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] < iVar6) {
            tcu::ThreadUtil::Thread::getMessage
                      ((Message *)local_1b0,
                       &(this->m_threads).
                        super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar14]->super_Thread,
                       local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar14]);
            auVar1 = local_1b0;
            dVar7 = this->m_beginTimeUs;
            tcu::ThreadUtil::Thread::getMessage
                      (&local_1d8,
                       &(this->m_threads).
                        super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar11]->super_Thread,
                       local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)uVar11]);
            uVar12 = local_1d8.m_time - this->m_beginTimeUs;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8.m_message._M_dataplus._M_p != &local_1d8.m_message.field_2) {
              operator_delete(local_1d8.m_message._M_dataplus._M_p,
                              local_1d8.m_message.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_p != local_198) {
              operator_delete(local_1a8._M_p,local_198[0]._M_allocated_capacity + 1);
            }
            if ((long)auVar1 - dVar7 < uVar12) {
              uVar11 = uVar14 & 0xffffffff;
            }
          }
          iVar6 = (int)uVar11;
          uVar14 = uVar14 + 1;
          ppEVar8 = (this->m_threads).
                    super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while ((long)uVar14 <
                 (long)(int)((ulong)((long)(this->m_threads).
                                           super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppEVar8) >> 3));
      }
      tcu::ThreadUtil::Thread::getMessage
                (&local_1d8,&ppEVar8[iVar6]->super_Thread,
                 local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar6]);
      local_1b0 = (undefined1  [8])this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"] (",3);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,local_1d8.m_message._M_dataplus._M_p,
                 local_1d8.m_message._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar6] =
           local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar6] + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.m_message._M_dataplus._M_p != &local_1d8.m_message.field_2) {
        operator_delete(local_1d8.m_message._M_dataplus._M_p,
                        local_1d8.m_message.field_2._M_allocated_capacity + 1);
      }
    } while (iVar5 != -1);
    if (this->m_timeOutTimeUs != 0) {
      local_1b0 = (undefined1  [8])this->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"[",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"] Execution timeout limit reached",0x21);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    ppEVar8 = (this->m_threads).
              super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = (uint)((ulong)((long)(this->m_threads).
                                 super__Vector_base<deqp::egl::GLES2ThreadTest::EGLThread_*,_std::allocator<deqp::egl::GLES2ThreadTest::EGLThread_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8) >> 3);
    if ((int)uVar3 < 1) {
      bVar2 = true;
      bVar9 = false;
    }
    else {
      bVar2 = true;
      uVar11 = 0;
      bVar9 = false;
      do {
        switch((ppEVar8[uVar11]->super_Thread).m_status) {
        default:
          bVar2 = false;
          break;
        case THREADSTATUS_READY:
          break;
        case THREADSTATUS_NOT_SUPPORTED:
          bVar9 = true;
        }
        uVar11 = uVar11 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar11);
    }
    if (bVar9) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Thread threw tcu::NotSupportedError",
                 glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                 ,0xea5);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    description = "Fail";
    if (bVar2) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
    if (local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    IVar4 = STOP;
  }
  return IVar4;
}

Assistant:

tcu::TestCase::IterateResult GLES2ThreadedSharingTest::iterate (void)
{
	if (!m_threadsStarted)
	{
		m_beginTimeUs = deGetMicroseconds();

		// Execute threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->exec();

		m_threadsStarted = true;
		m_threadsRunning = true;
	}

	if (m_threadsRunning)
	{
		// Wait threads to finish
		int readyThreads = 0;
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
				readyThreads++;
		}

		if (readyThreads == (int)m_threads.size())
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				m_threads[threadNdx]->join();

			m_executionReady	= true;
			m_requiresRestart	= false;
		}

		if (deGetMicroseconds() - m_beginTimeUs > m_timeOutUs)
		{
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getStatus() != tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING)
					m_threads[threadNdx]->join();
			}
			m_executionReady	= true;
			m_requiresRestart	= true;
			m_timeOutTimeUs		= deGetMicroseconds();
		}
		else
		{
			deSleep(m_sleepTimeMs);
		}
	}

	if (m_executionReady)
	{
		std::vector<int> indices(m_threads.size(), 0);

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "Execution timeout limit reached. Trying to get per thread logs. This is potentially dangerous." << tcu::TestLog::EndMessage;

		while (true)
		{
			int			firstThread = -1;

			// Find first thread with messages
			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				if (m_threads[threadNdx]->getMessageCount() > indices[threadNdx])
				{
					firstThread = threadNdx;
					break;
				}
			}

			// No more messages
			if (firstThread == -1)
				break;

			for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			{
				// No more messages in this thread
				if (m_threads[threadNdx]->getMessageCount() <= indices[threadNdx])
					continue;

				if ((m_threads[threadNdx]->getMessage(indices[threadNdx]).getTime() - m_beginTimeUs) < (m_threads[firstThread]->getMessage(indices[firstThread]).getTime() - m_beginTimeUs))
					firstThread = threadNdx;
			}

			tcu::ThreadUtil::Message message = m_threads[firstThread]->getMessage(indices[firstThread]);

			m_log << tcu::TestLog::Message << "[" << (message.getTime() - m_beginTimeUs) << "] (" << firstThread << ") " << message.getMessage() << tcu::TestLog::EndMessage;
			indices[firstThread]++;
		}

		if (m_timeOutTimeUs != 0)
			m_log << tcu::TestLog::Message << "[" << (m_timeOutTimeUs - m_beginTimeUs) << "] Execution timeout limit reached" << tcu::TestLog::EndMessage;

		bool isOk = true;
		bool notSupported = false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			const tcu::ThreadUtil::Thread::ThreadStatus status = m_threads[threadNdx]->getStatus();

			switch (status)
			{
				case tcu::ThreadUtil::Thread::THREADSTATUS_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_INIT_FAILED:
				case tcu::ThreadUtil::Thread::THREADSTATUS_RUNNING:
					isOk = false;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_NOT_SUPPORTED:
					notSupported = true;
					break;

				case tcu::ThreadUtil::Thread::THREADSTATUS_READY:
					// Nothing
					break;

				default:
					DE_ASSERT(false);
					isOk = false;
			};
		}

		if (notSupported)
			throw tcu::NotSupportedError("Thread threw tcu::NotSupportedError", "", __FILE__, __LINE__);

		if (isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	return CONTINUE;
}